

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::Impl::computeOptimizationHints(Impl *this)

{
  RawSchema *key;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Which WVar4;
  Which WVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  RawSchema ***pppRVar8;
  RawSchema **ppRVar9;
  Entry **ppEVar10;
  size_t *this_00;
  Iterator IVar11;
  RawSchema **dependent;
  RawSchema **__end2_2;
  RawSchema **__begin2_2;
  Vector<capnp::_::RawSchema_*> *__range2_2;
  Fault local_598;
  Maybe<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_&> local_590;
  Entry *local_588;
  Entry *_kj_result_1;
  Entry *entry_2;
  RawSchema *decision;
  Vector<capnp::_::RawSchema_*> *undecidedEntry;
  RawSchema *local_560;
  Vector<capnp::_::RawSchema_*> *_undecidedEntry1968;
  RawSchema **local_550;
  Fault local_548;
  Maybe<capnp::_::RawSchema_*&> local_540;
  RawSchema **local_538;
  RawSchema **_kj_result;
  RawSchema *dep;
  unsigned_long *d;
  unsigned_long *_d1955;
  uint64_t local_4e8;
  Reader local_4e0;
  Reader local_4b0;
  Reader local_480;
  undefined1 local_450 [8];
  Reader type_1;
  uint64_t local_3f0;
  undefined1 local_3e8 [8];
  Maybe<unsigned_long> depId;
  Reader field_1;
  undefined1 local_398 [8];
  Iterator __end2_1;
  undefined1 local_378 [8];
  Iterator __begin2_1;
  Reader *__range2_1;
  undefined1 local_300 [8];
  Reader node_1;
  RawSchema *schema_1;
  Entry *entry_1;
  Entry *__end1_1;
  Entry *__begin1_1;
  HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *__range1_1;
  Vector<capnp::_::RawSchema_*> decisions;
  Reader local_260;
  Reader local_230;
  Reader local_200;
  undefined1 local_1d0 [8];
  Reader type;
  Reader field;
  undefined1 local_160 [8];
  Iterator __end2;
  undefined1 local_140 [8];
  Iterator __begin2;
  Reader *__range2;
  undefined1 local_f0 [6];
  bool foundAnyStructs;
  bool foundAnyCaps;
  Reader structSchema;
  Reader node;
  RawSchema *schema;
  Entry *entry;
  Entry *__end1;
  Entry *local_68;
  Entry *__begin1;
  HashMap<unsigned_long,_capnp::_::RawSchema_*> *__range1;
  HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> undecided;
  Impl *this_local;
  
  undecided.table.indexes.impl._24_8_ = this;
  kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::HashMap
            ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)&__range1);
  local_68 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::begin(&this->schemas);
  pEVar6 = kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::end(&this->schemas);
  do {
    if (local_68 == pEVar6) {
      kj::Vector<capnp::_::RawSchema_*>::Vector((Vector<capnp::_::RawSchema_*> *)&__range1_1);
      __end1_1 = kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::begin
                           ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)
                            &__range1);
      pEVar7 = kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::end
                         ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)
                          &__range1);
      do {
        if (__end1_1 == pEVar7) {
          while( true ) {
            bVar2 = kj::Vector<capnp::_::RawSchema_*>::empty
                              ((Vector<capnp::_::RawSchema_*> *)&__range1_1);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              kj::Vector<capnp::_::RawSchema_*>::~Vector
                        ((Vector<capnp::_::RawSchema_*> *)&__range1_1);
              kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::~HashMap
                        ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)
                         &__range1);
              return;
            }
            ppRVar9 = kj::Vector<capnp::_::RawSchema_*>::back
                                ((Vector<capnp::_::RawSchema_*> *)&__range1_1);
            entry_2 = (Entry *)*ppRVar9;
            kj::Vector<capnp::_::RawSchema_*>::removeLast
                      ((Vector<capnp::_::RawSchema_*> *)&__range1_1);
            kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::
            findEntry<capnp::_::RawSchema*&>
                      ((HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>> *)&local_590,
                       (RawSchema **)&__range1);
            local_588 = kj::_::
                        readMaybe<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry>
                                  (&local_590);
            if (local_588 == (Entry *)0x0) break;
            ppEVar10 = kj::
                       mv<kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::Entry*>
                                 (&local_588);
            _kj_result_1 = *ppEVar10;
            this_00 = &(_kj_result_1->key).super_StringPtr.content.size_;
            __end2_2 = kj::Vector<capnp::_::RawSchema_*>::begin
                                 ((Vector<capnp::_::RawSchema_*> *)this_00);
            ppRVar9 = kj::Vector<capnp::_::RawSchema_*>::end
                                ((Vector<capnp::_::RawSchema_*> *)this_00);
            for (; __end2_2 != ppRVar9; __end2_2 = __end2_2 + 1) {
              if (((*__end2_2)->mayContainCapabilities & 1U) == 0) {
                (*__end2_2)->mayContainCapabilities = true;
                kj::Vector<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
                          ((Vector<capnp::_::RawSchema*> *)&__range1_1,__end2_2);
              }
            }
            kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::erase
                      ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)
                       &__range1,_kj_result_1);
          }
          kj::_::Debug::Fault::Fault
                    (&local_598,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x7c0,FAILED,"undecided.findEntry(decision) != nullptr","");
          kj::_::Debug::Fault::fatal(&local_598);
        }
        node_1._reader._40_8_ = (__end1_1->key).super_StringPtr.content.ptr;
        readMessageUnchecked<capnp::schema::Node>
                  ((Reader *)&__range2_1,*(word **)(node_1._reader._40_8_ + 8));
        capnp::schema::Node::Reader::getStruct((Reader *)local_300,(Reader *)&__range2_1);
        capnp::schema::Node::Struct::Reader::getFields
                  ((Reader *)&__begin2_1.index,(Reader *)local_300);
        IVar11 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin
                           ((Reader *)&__begin2_1.index);
        __end2_1._8_8_ = IVar11.container;
        __begin2_1.container._0_4_ = IVar11.index;
        local_378 = (undefined1  [8])__end2_1._8_8_;
        IVar11 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end
                           ((Reader *)&__begin2_1.index);
        local_398 = (undefined1  [8])IVar11.container;
        __end2_1.container._0_4_ = IVar11.index;
        while (bVar2 = _::
                       IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_378,
                                    (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_398), ((bVar2 ^ 0xffU) & 1) != 0) {
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator*((Reader *)&depId.ptr.field_1,
                      (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       *)local_378);
          kj::Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)local_3e8);
          WVar4 = capnp::schema::Field::Reader::which((Reader *)&depId.ptr.field_1);
          if (WVar4 == SLOT) {
            capnp::schema::Field::Reader::getSlot(&local_480,(Reader *)&depId.ptr.field_1);
            capnp::schema::Field::Slot::Reader::getType((Reader *)local_450,&local_480);
            while (bVar2 = capnp::schema::Type::Reader::isList((Reader *)local_450), bVar2) {
              capnp::schema::Type::Reader::getList(&local_4e0,(Reader *)local_450);
              capnp::schema::Type::List::Reader::getElementType(&local_4b0,&local_4e0);
              memcpy(local_450,&local_4b0,0x30);
            }
            bVar2 = capnp::schema::Type::Reader::isStruct((Reader *)local_450);
            if (bVar2) {
              capnp::schema::Type::Reader::getStruct((Reader *)&_d1955,(Reader *)local_450);
              local_4e8 = capnp::schema::Type::Struct::Reader::getTypeId((Reader *)&_d1955);
              kj::Maybe<unsigned_long>::operator=((Maybe<unsigned_long> *)local_3e8,&local_4e8);
            }
          }
          else if (WVar4 == GROUP) {
            capnp::schema::Field::Reader::getGroup
                      ((Reader *)&type_1._reader.nestingLimit,(Reader *)&depId.ptr.field_1);
            local_3f0 = capnp::schema::Field::Group::Reader::getTypeId
                                  ((Reader *)&type_1._reader.nestingLimit);
            kj::Maybe<unsigned_long>::operator=((Maybe<unsigned_long> *)local_3e8,&local_3f0);
          }
          d = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)local_3e8);
          if ((RawSchema *)d == (RawSchema *)0x0) {
LAB_0017770a:
            _undecidedEntry1968._4_4_ = 0;
          }
          else {
            dep = (RawSchema *)d;
            kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                      ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&local_540,
                       (unsigned_long *)&this->schemas);
            local_538 = kj::_::readMaybe<capnp::_::RawSchema*>(&local_540);
            if (local_538 == (RawSchema **)0x0) {
              kj::_::Debug::Fault::Fault
                        (&local_548,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                         ,0x7a4,FAILED,"schemas.find(d) != nullptr","");
              kj::_::Debug::Fault::fatal(&local_548);
            }
            pppRVar8 = kj::mv<capnp::_::RawSchema**>(&local_538);
            local_550 = *pppRVar8;
            _kj_result = (RawSchema **)*local_550;
            if ((((RawSchema *)_kj_result)->mayContainCapabilities & 1U) == 0) {
              kj::HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>>::
              find<capnp::_::RawSchema*&>
                        ((HashMap<capnp::_::RawSchema*,kj::Vector<capnp::_::RawSchema*>> *)
                         &undecidedEntry,(RawSchema **)&__range1);
              local_560 = (RawSchema *)
                          kj::_::readMaybe<kj::Vector<capnp::_::RawSchema*>>
                                    ((Maybe<kj::Vector<capnp::_::RawSchema_*>_&> *)&undecidedEntry);
              if (local_560 != (RawSchema *)0x0) {
                decision = local_560;
                kj::Vector<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
                          ((Vector<capnp::_::RawSchema*> *)local_560,
                           (RawSchema **)&node_1._reader.nestingLimit);
              }
              goto LAB_0017770a;
            }
            *(undefined1 *)(node_1._reader._40_8_ + 0x70) = 1;
            kj::Vector<capnp::_::RawSchema*>::add<capnp::_::RawSchema*&>
                      ((Vector<capnp::_::RawSchema*> *)&__range1_1,
                       (RawSchema **)&node_1._reader.nestingLimit);
            _undecidedEntry1968._4_4_ = 0xc;
          }
          kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)local_3e8);
          if (_undecidedEntry1968._4_4_ != 0) break;
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                        *)local_378);
        }
        __end1_1 = (Entry *)&__end1_1[1].value;
      } while( true );
    }
    key = local_68->value;
    key->mayContainCapabilities = true;
    if (key->lazyInitializer == (Initializer *)0x0) {
      readMessageUnchecked<capnp::schema::Node>
                ((Reader *)&structSchema._reader.nestingLimit,key->encodedNode);
      bVar2 = capnp::schema::Node::Reader::isStruct((Reader *)&structSchema._reader.nestingLimit);
      if (bVar2) {
        capnp::schema::Node::Reader::getStruct
                  ((Reader *)local_f0,(Reader *)&structSchema._reader.nestingLimit);
        bVar1 = false;
        bVar2 = false;
        capnp::schema::Node::Struct::Reader::getFields((Reader *)&__begin2.index,(Reader *)local_f0)
        ;
        IVar11 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::begin
                           ((Reader *)&__begin2.index);
        __end2._8_8_ = IVar11.container;
        __begin2.container._0_4_ = IVar11.index;
        local_140 = (undefined1  [8])__end2._8_8_;
        IVar11 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::end((Reader *)&__begin2.index);
        local_160 = (undefined1  [8])IVar11.container;
        __end2.container._0_4_ = IVar11.index;
        while (bVar3 = _::
                       IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       ::operator==((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_140,
                                    (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                                     *)local_160), ((bVar3 ^ 0xffU) & 1) != 0) {
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator*((Reader *)&type._reader.nestingLimit,
                      (IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                       *)local_140);
          WVar4 = capnp::schema::Field::Reader::which((Reader *)&type._reader.nestingLimit);
          if (WVar4 == SLOT) {
            capnp::schema::Field::Reader::getSlot(&local_200,(Reader *)&type._reader.nestingLimit);
            capnp::schema::Field::Slot::Reader::getType((Reader *)local_1d0,&local_200);
            while (bVar3 = capnp::schema::Type::Reader::isList((Reader *)local_1d0), bVar3) {
              capnp::schema::Type::Reader::getList(&local_260,(Reader *)local_1d0);
              capnp::schema::Type::List::Reader::getElementType(&local_230,&local_260);
              memcpy(local_1d0,&local_230,0x30);
            }
            WVar5 = capnp::schema::Type::Reader::which((Reader *)local_1d0);
            switch(WVar5) {
            case VOID:
            case BOOL:
            case INT8:
            case INT16:
            case INT32:
            case INT64:
            case UINT8:
            case UINT16:
            case UINT32:
            case UINT64:
            case FLOAT32:
            case FLOAT64:
            case TEXT:
            case DATA:
            case ENUM:
              break;
            case LIST:
              kj::_::unreachable();
            case STRUCT:
              bVar2 = true;
              break;
            case INTERFACE:
            case ANY_POINTER:
              bVar1 = true;
            }
          }
          else if (WVar4 == GROUP) {
            bVar2 = true;
          }
          if (bVar1) break;
          _::
          IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
          ::operator++((IndexingIterator<const_capnp::List<capnp::schema::Field,_(capnp::Kind)3>::Reader,_capnp::schema::Field::Reader>
                        *)local_140);
        }
        if (!bVar1) {
          if (bVar2) {
            key->mayContainCapabilities = false;
            decisions.builder.disposer = (ArrayDisposer *)0x0;
            kj::Vector<capnp::_::RawSchema_*>::Vector
                      ((Vector<capnp::_::RawSchema_*> *)&decisions.builder.disposer);
            kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::insert
                      ((HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_> *)
                       &__range1,key,(Vector<capnp::_::RawSchema_*> *)&decisions.builder.disposer);
            kj::Vector<capnp::_::RawSchema_*>::~Vector
                      ((Vector<capnp::_::RawSchema_*> *)&decisions.builder.disposer);
          }
          else {
            key->mayContainCapabilities = false;
          }
        }
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void SchemaLoader::Impl::computeOptimizationHints() {
  kj::HashMap<_::RawSchema*, kj::Vector<_::RawSchema*>> undecided;
  // This map contains schemas for which we haven't yet decided if they might have capabilities.
  // They at least do not directly contain capabilities, but they can't be fully decided until
  // the dependents are decided.
  //
  // Each entry maps to a list of other schemas whose decisions depend on this schema. When a
  // schema in the map is discovered to contain capabilities, then all these dependents must also
  // be presumed to contain capabilities.

  // First pass: Decide on the easy cases and populate the `undecided` map with hard cases.
  for (auto& entry: schemas) {
    _::RawSchema* schema = entry.value;

    // Default to assuming everything could contain caps.
    schema->mayContainCapabilities = true;

    if (schema->lazyInitializer != nullptr) {
      // Not initialized yet, so we have to be conservative and assume there could be capabilities.
      continue;
    }

    auto node = readMessageUnchecked<schema::Node>(schema->encodedNode);

    if (!node.isStruct()) {
      // Non-structs are irrelevant.
      continue;
    }

    auto structSchema = node.getStruct();

    bool foundAnyCaps = false;
    bool foundAnyStructs = false;
    for (auto field: structSchema.getFields()) {
      switch (field.which()) {
        case schema::Field::GROUP:
          foundAnyStructs = true;
          break;
        case schema::Field::SLOT: {
          auto type = field.getSlot().getType();
          while (type.isList()) {
            type = type.getList().getElementType();
          }

          switch (type.which()) {
            case schema::Type::VOID:
            case schema::Type::BOOL:
            case schema::Type::INT8:
            case schema::Type::INT16:
            case schema::Type::INT32:
            case schema::Type::INT64:
            case schema::Type::UINT8:
            case schema::Type::UINT16:
            case schema::Type::UINT32:
            case schema::Type::UINT64:
            case schema::Type::FLOAT32:
            case schema::Type::FLOAT64:
            case schema::Type::TEXT:
            case schema::Type::DATA:
            case schema::Type::ENUM:
              // Not a capability.
              break;

            case schema::Type::STRUCT:
              foundAnyStructs = true;
              break;

            case schema::Type::ANY_POINTER:  // could be a capability, or transitively contain one
            case schema::Type::INTERFACE:    // definitely a capability
              foundAnyCaps = true;
              break;

            case schema::Type::LIST:
              KJ_UNREACHABLE;  // handled above
          }
          break;
        }
      }

      if (foundAnyCaps) break;  // no point continuing
    }

    if (foundAnyCaps) {
      // Definitely has capabilities, don't add to `undecided`.
    } else if (!foundAnyStructs) {
      // Definitely does NOT have capabilities. Go ahead and set the hint and don't add to
      // `undecided`.
      schema->mayContainCapabilities = false;
    } else {
      // Don't know yet. Mark as no-capabilities for now, but place in `undecided` set to review
      // later.
      schema->mayContainCapabilities = false;
      undecided.insert(schema, {});
    }
  }

  // Second pass: For all undecided schemas, check dependencies and register as dependents where
  // needed.
  kj::Vector<_::RawSchema*> decisions;  // Schemas that have become decided.
  for (auto& entry: undecided) {
    auto schema = entry.key;

    auto node = readMessageUnchecked<schema::Node>(schema->encodedNode).getStruct();

    for (auto field: node.getFields()) {
      kj::Maybe<uint64_t> depId;

      switch (field.which()) {
        case schema::Field::GROUP:
          depId = field.getGroup().getTypeId();
          break;
        case schema::Field::SLOT: {
          auto type = field.getSlot().getType();
          while (type.isList()) {
            type = type.getList().getElementType();
          }
          if (type.isStruct()) {
            depId = type.getStruct().getTypeId();
          }
          break;
        }
      }

      KJ_IF_SOME(d, depId) {
        _::RawSchema* dep = KJ_ASSERT_NONNULL(schemas.find(d));

        if (dep->mayContainCapabilities) {
          // Oops, this dependency is already known to have capabilities. So that means the current
          // schema also has capabilities, transitively. Mark it as such.
          schema->mayContainCapabilities = true;

          // Schedule this schema for removal later.
          decisions.add(schema);

          // Might as well end the loop early.
          break;
        } else KJ_IF_SOME(undecidedEntry, undecided.find(dep)) {
          // This dependency is in the undecided set. Register interest in it.
          undecidedEntry.add(schema);
        } else {
          // This dependency is decided, and the decision is that it has no capabilities. So it
          // has no impact on the dependent.
        }
      }
    }
  }

  // Third pass: For each decision we made, remove it and propagate to its dependents.
  while (!decisions.empty()) {
    _::RawSchema* decision = decisions.back();
    decisions.removeLast();

    auto& entry = KJ_ASSERT_NONNULL(undecided.findEntry(decision));
    for (auto& dependent: entry.value) {
      if (!dependent->mayContainCapabilities) {
        // The dependent was not previously decided. But, we now know it has a dependency which has
        // capabilities, therefore we can decide the dependent.
        dependent->mayContainCapabilities = true;
        decisions.add(dependent);
      }
    }
    undecided.erase(entry);
  }

  // Everything that is left in `undecided` must only be waiting on other undecided schemas. We
  // can therefore decide that none of them have any capabilities. We marked them as such
  // earlier so now we're all done.
}